

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space2.cpp
# Opt level: O3

void drop_bomb_proc(Am_Object param_1)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Am_Value *pAVar7;
  Am_Object *pAVar8;
  Am_Object alien;
  int bomb_top;
  int bomb_left;
  Am_Object new_bomb;
  Am_Object bomb_owner;
  Am_Value_List aliens;
  Am_Object local_68;
  Am_Object local_60;
  uint local_58;
  uint local_54;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Value_List local_38 [16];
  
  uVar4 = rand();
  if ((uVar4 & 0x20) == 0) {
    pAVar7 = (Am_Value *)Am_Object::Get(0x82f8,(ulong)NUM_ALIENS);
    iVar5 = Am_Value::operator_cast_to_int(pAVar7);
    if (iVar5 != 0) {
      iVar6 = rand();
      pAVar7 = (Am_Value *)Am_Object::Get(0x82f8,0x82);
      Am_Value_List::Am_Value_List(local_38,pAVar7);
      local_68.data = (Am_Object_Data *)0x0;
      Am_Value_List::Start();
      iVar5 = (iVar6 >> 4) % iVar5 + 1;
      while( true ) {
        cVar1 = Am_Value_List::Last();
        uVar3 = (ushort)&local_68;
        if (cVar1 != '\0') break;
        pAVar7 = (Am_Value *)Am_Value_List::Get();
        Am_Object::operator=(&local_68,pAVar7);
        Am_Object::Get(uVar3,0xb0);
        bVar2 = Am_Value::Valid();
        iVar5 = iVar5 - (uint)bVar2;
        if (iVar5 == 0) break;
        Am_Object::operator=(&local_68,(Am_Object *)&Am_No_Object);
        Am_Value_List::Next();
      }
      cVar1 = Am_Object::operator==(&local_68,(Am_Object *)&Am_No_Object);
      if (cVar1 == '\0') {
        Am_Object::Get_Object((ushort)&local_48,0x1082d8);
        local_50.data = (Am_Object_Data *)0x0;
        pAVar7 = (Am_Value *)Am_Object::Get(uVar3,100);
        iVar5 = Am_Value::operator_cast_to_int(pAVar7);
        pAVar7 = (Am_Value *)Am_Object::Get(uVar3,0x66);
        iVar6 = Am_Value::operator_cast_to_int(pAVar7);
        uVar4 = iVar6 / 2 + iVar5;
        local_54 = uVar4;
        pAVar7 = (Am_Value *)Am_Object::Get(uVar3,0x65);
        iVar5 = Am_Value::operator_cast_to_int(pAVar7);
        pAVar7 = (Am_Value *)Am_Object::Get(uVar3,0x67);
        iVar6 = Am_Value::operator_cast_to_int(pAVar7);
        local_58 = iVar6 + iVar5;
        Am_Object::Get_Object((ushort)&local_60,(ulong)&local_68);
        Am_Translate_Coordinates
                  (&local_60,uVar4,iVar6 + iVar5,&local_48,(int *)&local_54,(int *)&local_58);
        Am_Object::~Am_Object(&local_60);
        Am_Object::Create((char *)&local_60);
        uVar3 = Am_Object::Set((ushort)&local_60,100,(ulong)local_54);
        pAVar8 = (Am_Object *)Am_Object::Set(uVar3,0x65,(ulong)local_58);
        pAVar8 = (Am_Object *)Am_Object::operator=(&local_50,pAVar8);
        Am_Object::Am_Object(&local_40,pAVar8);
        Am_Object::Add_Part((Am_Object_Data *)&local_48,SUB81(&local_40,0),1);
        Am_Object::~Am_Object(&local_40);
        Am_Object::~Am_Object(&local_60);
        Am_Object::Set((ushort)&local_50,0x65,1000);
        Am_Object::~Am_Object(&local_50);
        Am_Object::~Am_Object(&local_48);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Oops.\n",6);
      }
      Am_Object::~Am_Object(&local_68);
      Am_Value_List::~Am_Value_List(local_38);
    }
  }
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, drop_bomb, (Am_Object /*cmd*/))
{
  // Only drop a bomb 50% of the time we call this, for some variation.
  if (rand() >> 5 & 0x1)
    return; // test one of the middle bits
  int num_aliens = Aliens.Get(NUM_ALIENS);
  if (!num_aliens)
    return; // no one is left to shoot!

  // Not an even distribution, but it'll do.
  int alien_shooting = (rand() >> 4) % num_aliens + 1;
  Am_Value_List aliens = Aliens.Get(Am_GRAPHICAL_PARTS);
  Am_Object alien;
  for (aliens.Start(); !aliens.Last(); aliens.Next()) {
    alien = aliens.Get();
    //    if (alien.Get(Am_LINE_STYLE) != Am_No_Style)  // alien is not dead
    if (alien.Get(Am_IMAGE).Valid())
      alien_shooting--;
    if (alien_shooting)
      alien = Am_No_Object;
    else
      break;
  }
  if (alien == Am_No_Object) {
    cout << "Oops.\n";
    return;
  }
  // now alien contains the alien we're dealing with.
  Am_Object bomb_owner = Ship.Get_Owner();
  Am_Object new_bomb;
  int bomb_left = (int)alien.Get(Am_LEFT) + (int)alien.Get(Am_WIDTH) / 2;
  int bomb_top = (int)alien.Get(Am_TOP) + (int)alien.Get(Am_HEIGHT);
  Am_Translate_Coordinates(alien.Get_Owner(), bomb_left, bomb_top, bomb_owner,
                           bomb_left, bomb_top);
  bomb_owner.Add_Part(new_bomb = Bomb.Create("Live_Bomb")
                                     .Set(Am_LEFT, bomb_left)
                                     .Set(Am_TOP, bomb_top));
  // send the bomb downscreen
  new_bomb.Set(Am_TOP, 1000);
}